

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O1

QStringList * xdgConfigDirs(void)

{
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QString local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable(&local_38,"XDG_CONFIG_DIRS");
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  dirsList(in_RDI,&local_38);
  if ((in_RDI->d).size == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"/etc/xdg";
    local_50.d.size = 8;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)in_RDI,0,&local_50);
    QList<QString>::end(in_RDI);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList xdgConfigDirs()
{
    // http://standards.freedesktop.org/basedir-spec/latest/
    const QString xdgConfigDirs = qEnvironmentVariable("XDG_CONFIG_DIRS");

    QStringList dirs = dirsList(xdgConfigDirs);
    if (dirs.isEmpty())
        dirs.push_back(u"/etc/xdg"_s);

    return dirs;
}